

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O2

void __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::expansion
          (Simplex_tree<Gudhi::Simplex_tree_options_default> *this,int max_dim)

{
  pointer pvVar1;
  Siblings *siblings;
  pointer ppVar2;
  Dictionary_it root_it;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_false>
  local_28;
  
  if (1 < max_dim) {
    pvVar1 = (this->filtration_vect_).
             super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->filtration_vect_).
        super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pvVar1) {
      (this->filtration_vect_).
      super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pvVar1;
    }
    this->dimension_ = max_dim;
    ppVar2 = (this->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_start;
    local_28.m_ptr =
         (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
          *)ppVar2;
    while (local_28.m_ptr !=
           (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
            *)(ppVar2 + (this->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_size)) {
      siblings = ((local_28.m_ptr)->second).children_;
      if (siblings->parent_ == (local_28.m_ptr)->first) {
        siblings_expansion(this,siblings,max_dim + -1);
      }
      boost::container::
      vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_false>
      ::operator++(&local_28);
      ppVar2 = (this->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_start;
    }
    this->dimension_ = max_dim - this->dimension_;
  }
  return;
}

Assistant:

void expansion(int max_dim) {
    if (max_dim <= 1) return;
    clear_filtration(); // Drop the cache.
    dimension_ = max_dim;
    for (Dictionary_it root_it = root_.members_.begin();
         root_it != root_.members_.end(); ++root_it) {
      if (has_children(root_it)) {
        siblings_expansion(root_it->second.children(), max_dim - 1);
      }
    }
    dimension_ = max_dim - dimension_;
  }